

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::read_in_particle_samples_gzipped(particleSamples *this)

{
  int iVar1;
  _Ios_Openmode _Var2;
  void *pvVar3;
  istream *piVar4;
  value_type *__x;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int ievent;
  int num_particles;
  int temp_monval;
  int n_particle;
  string temp_string;
  istream *in_stack_fffffffffffffb68;
  istream *in_stack_fffffffffffffb70;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffffb88;
  particleSamples *in_stack_fffffffffffffb90;
  double local_418 [2];
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0 [5];
  stringstream local_3a8 [200];
  gzFile in_stack_fffffffffffffd20;
  particleSamples *in_stack_fffffffffffffd28;
  string local_220 [36];
  int local_1fc;
  stringstream local_1f8 [392];
  void *local_70;
  string local_58 [32];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::__cxx11::string::string(local_28);
  local_34 = 0;
  local_38 = 0;
  while (local_34 < *(int *)(in_RDI + 0x5f0)) {
    gz_readline_abi_cxx11_(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    std::__cxx11::string::operator=(local_28,local_58);
    std::__cxx11::string::~string(local_58);
    iVar1 = gzeof(*(undefined8 *)(in_RDI + 0x5e0));
    if (iVar1 != 0) break;
    pvVar3 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x1489fc);
    local_70 = pvVar3;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1f8,local_28,_Var2);
    std::istream::operator>>((istream *)local_1f8,&local_2c);
    for (local_1fc = 0; local_1fc < local_2c; local_1fc = local_1fc + 1) {
      gz_readline_abi_cxx11_(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      std::__cxx11::string::operator=(local_28,local_220);
      std::__cxx11::string::~string(local_220);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_3a8,local_28,_Var2);
      std::istream::operator>>((istream *)local_3a8,&local_30);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_3a8,local_418);
      piVar4 = (istream *)std::istream::operator>>(piVar4,local_3d0);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3e8);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3e0);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_3d8);
      __x = (value_type *)std::istream::operator>>(piVar4,&local_3f0);
      in_stack_fffffffffffffb70 = (istream *)std::istream::operator>>((istream *)__x,&local_408);
      in_stack_fffffffffffffb68 =
           (istream *)std::istream::operator>>(in_stack_fffffffffffffb70,&local_400);
      std::istream::operator>>(in_stack_fffffffffffffb68,&local_3f8);
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     **)(in_RDI + 0x690),(long)local_38);
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                ((vector<particle_info,_std::allocator<particle_info>_> *)piVar4,__x);
      std::__cxx11::stringstream::~stringstream(local_3a8);
    }
    local_34 = local_2c + local_34;
    local_38 = local_38 + 1;
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_gzipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle;
    int temp_monval;
    int num_particles = 0;
    int ievent = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_gz);

        if (gzeof(inputfile_gz)) break;

        // create one event
        full_particle_list->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_gz);
            std::stringstream temp2(temp_string);
            temp2 >> temp_monval;
            particle_info temp_particle_info;
            temp_particle_info.monval = temp_monval;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;

            (*full_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}